

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

void mdl_free(mdl_t *mdl)

{
  double *in_RDI;
  
  free((void *)in_RDI[4]);
  free((void *)in_RDI[5]);
  free((void *)in_RDI[6]);
  if (in_RDI[7] != 0.0) {
    xvm_free(in_RDI);
  }
  if (in_RDI[8] != 0.0) {
    rdr_freedat((dat_t *)mdl);
  }
  if (in_RDI[9] != 0.0) {
    rdr_freedat((dat_t *)mdl);
  }
  if (in_RDI[10] != 0.0) {
    rdr_free((rdr_t *)mdl);
  }
  if (in_RDI[0xb] != 0.0) {
    free((void *)in_RDI[0xb]);
  }
  free(in_RDI);
  return;
}

Assistant:

void mdl_free(mdl_t *mdl) {
	free(mdl->kind);
	free(mdl->uoff);
	free(mdl->boff);
	if (mdl->theta != NULL)
		xvm_free(mdl->theta);
	if (mdl->train != NULL)
		rdr_freedat(mdl->train);
	if (mdl->devel != NULL)
		rdr_freedat(mdl->devel);
	if (mdl->reader != NULL)
		rdr_free(mdl->reader);
	if (mdl->werr != NULL)
		free(mdl->werr);
	free(mdl);
}